

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_token.cpp
# Opt level: O1

void __thiscall
CNetTokenCache::AddToken(CNetTokenCache *this,NETADDR *pAddr,TOKEN Token,int TokenFLag)

{
  CNetBase *this_00;
  int iVar1;
  TOKEN ResponseToken;
  CConnlessPacketInfo *pCVar2;
  int64 iVar3;
  int64 iVar4;
  undefined8 *puVar5;
  CConnlessPacketInfo *pCVar6;
  CConnlessPacketInfo *pCVar7;
  CConnlessPacketInfo *a;
  long in_FS_OFFSET;
  NETADDR NullAddr;
  NETADDR local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (Token != 0xffffffff) {
    if (this->m_pConnlessPacketList != (CConnlessPacketInfo *)0x0) {
      pCVar6 = (CConnlessPacketInfo *)0x0;
      a = this->m_pConnlessPacketList;
      do {
        local_58.ip[4] = '\0';
        local_58.ip[5] = '\0';
        local_58.ip[6] = '\0';
        local_58.ip[7] = '\0';
        local_58.ip[8] = '\0';
        local_58.ip[9] = '\0';
        local_58.ip[10] = '\0';
        local_58.ip[0xb] = '\0';
        local_58.ip[0xc] = '\0';
        local_58.ip[0xd] = '\0';
        local_58.ip[0xe] = '\0';
        local_58.ip[0xf] = '\0';
        local_58.port = 0;
        local_58.reserved = 0;
        local_58.type = 7;
        local_58.ip[0] = '\0';
        local_58.ip[1] = '\0';
        local_58.ip[2] = '\0';
        local_58.ip[3] = '\0';
        iVar1 = net_addr_comp(&a->m_Addr,pAddr,1);
        if (iVar1 == 0) {
LAB_0013dbbe:
          if (a->m_pfnCallback != (FSendCallback)0x0) {
            (*a->m_pfnCallback)(a->m_TrackID,a->m_pCallbackUser);
          }
          this_00 = this->m_pNetBase;
          ResponseToken = CNetTokenManager::GenerateToken(pAddr,this->m_pTokenManager->m_Seed);
          CNetBase::SendPacketConnless
                    (this_00,&a->m_Addr,Token,ResponseToken,a->m_aData,a->m_DataSize);
          pCVar7 = a->m_pNext;
          if (pCVar6 != (CConnlessPacketInfo *)0x0) {
            pCVar6->m_pNext = pCVar7;
          }
          if (a == this->m_pConnlessPacketList) {
            this->m_pConnlessPacketList = pCVar7;
          }
          operator_delete(a,0x5c0);
        }
        else {
          if ((TokenFLag & 1U) != 0) {
            iVar1 = net_addr_comp(&a->m_Addr,&local_58,0);
            if (iVar1 == 0) goto LAB_0013dbbe;
          }
          pCVar2 = a;
          if (pCVar6 != (CConnlessPacketInfo *)0x0) {
            pCVar2 = pCVar6->m_pNext;
          }
          pCVar7 = a->m_pNext;
          pCVar6 = pCVar2;
        }
        a = pCVar7;
      } while (pCVar7 != (CConnlessPacketInfo *)0x0);
    }
    if ((TokenFLag & 2U) == 0) {
      local_58._16_8_ = *(undefined8 *)(pAddr->ip + 0xc);
      local_58.type = pAddr->type;
      local_58.ip[0] = pAddr->ip[0];
      local_58.ip[1] = pAddr->ip[1];
      local_58.ip[2] = pAddr->ip[2];
      local_58.ip[3] = pAddr->ip[3];
      local_58.ip._4_8_ = *(undefined8 *)(pAddr->ip + 4);
      iVar3 = time_get();
      iVar4 = time_freq();
      puVar5 = (undefined8 *)CRingBufferBase::Allocate((CRingBufferBase *)this,0x28);
      *puVar5 = local_58._0_8_;
      puVar5[1] = local_58.ip._4_8_;
      puVar5[2] = local_58._16_8_;
      *(TOKEN *)(puVar5 + 3) = Token;
      puVar5[4] = iVar4 * 0x10 + iVar3;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CNetTokenCache::AddToken(const NETADDR *pAddr, TOKEN Token, int TokenFLag)
{
	if(Token == NET_TOKEN_NONE)
		return;

	// search the list of packets to be sent
	// for this address
	CConnlessPacketInfo *pPrevInfo = 0;
	CConnlessPacketInfo *pInfo = m_pConnlessPacketList;
	bool Found = false;
	while(pInfo)
	{
		NETADDR NullAddr = { 0 };
		NullAddr.type = 7;	// cover broadcasts
		if(net_addr_comp(&pInfo->m_Addr, pAddr, true) == 0 || ((TokenFLag&NET_TOKENFLAG_ALLOWBROADCAST) && net_addr_comp(&pInfo->m_Addr, &NullAddr, false) == 0))
		{
			// notify the user that the packet gets delivered
			if(pInfo->m_pfnCallback)
				pInfo->m_pfnCallback(pInfo->m_TrackID, pInfo->m_pCallbackUser);
			m_pNetBase->SendPacketConnless(&(pInfo->m_Addr), Token, m_pTokenManager->GenerateToken(pAddr), pInfo->m_aData, pInfo->m_DataSize);
			CConnlessPacketInfo *pNext = pInfo->m_pNext;
			if(pPrevInfo)
				pPrevInfo->m_pNext = pNext;
			if(pInfo == m_pConnlessPacketList)
				m_pConnlessPacketList = pNext;
			delete pInfo;
			pInfo = pNext;
		}
		else
		{
			if(pPrevInfo)
				pPrevInfo = pPrevInfo->m_pNext;
			else
				pPrevInfo = pInfo;
			pInfo = pInfo->m_pNext;
		}
	}

	// add the token
	if(Found || !(TokenFLag&NET_TOKENFLAG_RESPONSEONLY))
	{
		CAddressInfo Info;
		Info.m_Addr = *pAddr;
		Info.m_Token = Token;
		Info.m_Expiry = time_get() + time_freq() * NET_TOKENCACHE_ADDRESSEXPIRY;
		(*m_TokenCache.Allocate(sizeof(Info))) = Info;
	}
}